

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O2

unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> __thiscall
anon_unknown.dwarf_2b5518::LocalFileSystem::getFileContents(LocalFileSystem *this,string *path)

{
  storage_type *psVar1;
  string *in_RDX;
  MemoryBuffer *pMVar2;
  error_code eVar3;
  ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_> result;
  Twine local_38;
  
  llvm::Twine::Twine(&local_38,in_RDX);
  pMVar2 = (MemoryBuffer *)0x0;
  llvm::MemoryBuffer::getFile(&result,&local_38,-1,true,false);
  eVar3 = llvm::
          ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>::
          getError(&result);
  if (eVar3._M_value == 0) {
    psVar1 = llvm::
             ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
             ::getStorage(&result);
    pMVar2 = (psVar1->_M_t).
             super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>.
             _M_t.
             super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
             super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl;
    (psVar1->_M_t).
    super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>._M_t.
    super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
    super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl = (MemoryBuffer *)0x0;
  }
  (this->super_FileSystem)._vptr_FileSystem = (_func_int **)pMVar2;
  llvm::ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>::
  ~ErrorOr(&result);
  return (__uniq_ptr_data<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>,_true,_true>)
         (__uniq_ptr_data<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>,_true,_true>)
         this;
}

Assistant:

virtual std::unique_ptr<llvm::MemoryBuffer>
  getFileContents(const std::string& path) override {
    auto result = llvm::MemoryBuffer::getFile(path);
    if (result.getError()) {
      return nullptr;
    }
    return std::unique_ptr<llvm::MemoryBuffer>(result->release());
  }